

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyUriDecode(char *zSrc,sxu32 nLen,ProcConsumer xConsumer,void *pUserData,int bUTF8)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  sxi32 sVar6;
  uint uVar7;
  sxu8 *psVar8;
  bool bVar9;
  sxi32 rc;
  sxi32 d;
  sxi32 c;
  sxu8 zOut [10];
  sxu8 *zOutPtr;
  char *zCur;
  char *zEnd;
  char *zIn;
  int bUTF8_local;
  void *pUserData_local;
  ProcConsumer xConsumer_local;
  sxu32 nLen_local;
  char *zSrc_local;
  
  psVar8 = (sxu8 *)(zSrc + nLen);
  zOutPtr = (sxu8 *)zSrc;
  zEnd = zSrc;
  do {
    while( true ) {
      bVar9 = false;
      if ((zOutPtr < psVar8) && (bVar9 = false, *zOutPtr != '%')) {
        bVar9 = *zOutPtr != '+';
      }
      if (!bVar9) break;
      zOutPtr = zOutPtr + 1;
    }
    if ((zOutPtr != (sxu8 *)zEnd) &&
       (iVar5 = (*xConsumer)(zEnd,(int)zOutPtr - (int)zEnd,pUserData), iVar5 != 0)) {
      return iVar5;
    }
    if (psVar8 <= zOutPtr) {
      return 0;
    }
    zOut._2_8_ = (long)&d + 2;
    if (*zOutPtr == '+') {
      zOut._2_8_ = (long)&d + 3;
      d._2_1_ = 0x20;
      zOutPtr = zOutPtr + 1;
    }
    else {
      if (psVar8 <= zOutPtr + 2) {
        return -0xf;
      }
      sVar6 = SyAsciiToHex((int)(char)zOutPtr[1]);
      uVar7 = SyAsciiToHex((int)(char)zOutPtr[2]);
      uVar7 = sVar6 << 4 | uVar7;
      zOutPtr = zOutPtr + 3;
      if ((int)uVar7 < 0xc0) {
        lVar3 = zOut._2_8_ + 1;
        *(char *)zOut._2_8_ = (char)uVar7;
        zOut._2_8_ = lVar3;
      }
      else {
        rc = (sxi32)""[(int)(uVar7 - 0xc0)];
        for (; *zOutPtr == '%'; zOutPtr = zOutPtr + 3) {
          sVar6 = SyAsciiToHex((int)(char)zOutPtr[1]);
          uVar7 = SyAsciiToHex((int)(char)zOutPtr[2]);
          uVar7 = sVar6 << 4 | uVar7;
          if ((uVar7 & 0xc0) != 0x80) break;
          rc = rc * 0x40 + (uVar7 & 0x3f);
        }
        bVar4 = (byte)rc;
        if (bUTF8 == 0) {
          lVar3 = zOut._2_8_ + 1;
          *(byte *)zOut._2_8_ = bVar4;
          zOut._2_8_ = lVar3;
        }
        else if (rc < 0x80) {
          lVar3 = zOut._2_8_ + 1;
          *(byte *)zOut._2_8_ = bVar4;
          zOut._2_8_ = lVar3;
        }
        else {
          bVar1 = (byte)(rc >> 6);
          if (rc < 0x800) {
            lVar3 = zOut._2_8_ + 1;
            *(byte *)zOut._2_8_ = (bVar1 & 0x1f) - 0x40;
            zOut._2_8_ = lVar3;
            lVar3 = zOut._2_8_ + 1;
            *(byte *)zOut._2_8_ = (bVar4 & 0x3f) + 0x80;
            zOut._2_8_ = lVar3;
          }
          else {
            bVar2 = (byte)(rc >> 0xc);
            if (rc < 0x10000) {
              lVar3 = zOut._2_8_ + 1;
              *(byte *)zOut._2_8_ = (bVar2 & 0xf) - 0x20;
              zOut._2_8_ = lVar3;
              lVar3 = zOut._2_8_ + 1;
              *(byte *)zOut._2_8_ = (bVar1 & 0x3f) + 0x80;
              zOut._2_8_ = lVar3;
              lVar3 = zOut._2_8_ + 1;
              *(byte *)zOut._2_8_ = (bVar4 & 0x3f) + 0x80;
              zOut._2_8_ = lVar3;
            }
            else {
              lVar3 = zOut._2_8_ + 1;
              *(byte *)zOut._2_8_ = ((byte)(rc >> 0x12) & 7) - 0x10;
              zOut._2_8_ = lVar3;
              lVar3 = zOut._2_8_ + 1;
              *(byte *)zOut._2_8_ = (bVar2 & 0x3f) + 0x80;
              zOut._2_8_ = lVar3;
              lVar3 = zOut._2_8_ + 1;
              *(byte *)zOut._2_8_ = (bVar1 & 0x3f) + 0x80;
              zOut._2_8_ = lVar3;
              lVar3 = zOut._2_8_ + 1;
              *(byte *)zOut._2_8_ = (bVar4 & 0x3f) + 0x80;
              zOut._2_8_ = lVar3;
            }
          }
        }
      }
    }
    iVar5 = (*xConsumer)((void *)((long)&d + 2),(int)zOut._2_8_ - ((int)&d + 2),pUserData);
    if (iVar5 != 0) {
      return iVar5;
    }
    zEnd = (char *)zOutPtr;
  } while( true );
}

Assistant:

JX9_PRIVATE sxi32 SyUriDecode(const char *zSrc, sxu32 nLen, ProcConsumer xConsumer, void *pUserData, int bUTF8)
{
	static const sxu8 Utf8Trans[] = {
		0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07, 
		0x08, 0x09, 0x0a, 0x0b, 0x0c, 0x0d, 0x0e, 0x0f, 
		0x10, 0x11, 0x12, 0x13, 0x14, 0x15, 0x16, 0x17, 
		0x18, 0x19, 0x1a, 0x1b, 0x1c, 0x1d, 0x1e, 0x1f, 
		0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07, 
		0x08, 0x09, 0x0a, 0x0b, 0x0c, 0x0d, 0x0e, 0x0f, 
		0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07, 
		0x00, 0x01, 0x02, 0x03, 0x00, 0x01, 0x00, 0x00
	};
	const char *zIn = zSrc;
	const char *zEnd;
	const char *zCur;
	sxu8 *zOutPtr;
	sxu8 zOut[10];
	sxi32 c, d;
	sxi32 rc;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) || xConsumer == 0 ){
		return SXERR_EMPTY;
	}
#endif
	rc = SXRET_OK;
	zEnd = &zSrc[nLen];
	zCur = zIn;
	for(;;){
		while(zCur < zEnd && zCur[0] != '%' && zCur[0] != '+' ){
			zCur++;
		}
		if( zCur != zIn ){
			/* Consume input */
			rc = xConsumer(zIn, (unsigned int)(zCur-zIn), pUserData);
			if( rc != SXRET_OK ){
				/* User consumer routine request an operation abort */
				break;
			}
		}
		if( zCur >= zEnd ){
			rc = SXRET_OK;
			break;
		}
		/* Decode unsafe HTTP characters */
		zOutPtr = zOut;
		if( zCur[0] == '+' ){
			*zOutPtr++ = ' ';
			zCur++;
		}else{
			if( &zCur[2] >= zEnd ){
				rc = SXERR_OVERFLOW;
				break;
			}
			c = (SyAsciiToHex(zCur[1]) <<4) | SyAsciiToHex(zCur[2]);
			zCur += 3;
			if( c < 0x000C0 ){
				*zOutPtr++ = (sxu8)c;
			}else{
				c = Utf8Trans[c-0xC0];
				while( zCur[0] == '%' ){
					d = (SyAsciiToHex(zCur[1]) <<4) | SyAsciiToHex(zCur[2]);
					if( (d&0xC0) != 0x80 ){
						break;
					}
					c = (c<<6) + (0x3f & d);
					zCur += 3;
				}
				if( bUTF8 == FALSE ){
					*zOutPtr++ = (sxu8)c;
				}else{
					SX_WRITE_UTF8(zOutPtr, c);
				}
			}
			
		}
		/* Consume the decoded characters */
		rc = xConsumer((const void *)zOut, (unsigned int)(zOutPtr-zOut), pUserData);
		if( rc != SXRET_OK ){
			break;
		}
		/* Synchronize pointers */
		zIn = zCur;
	}
	return rc;
}